

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cc
# Opt level: O2

bool __thiscall prometheus::detail::CurlWrapper::addHttpHeader(CurlWrapper *this,string *header)

{
  curl_slist *pcVar1;
  
  ::std::mutex::lock(&this->mutex_);
  pcVar1 = (curl_slist *)curl_slist_append(this->optHttpHeader_,(header->_M_dataplus)._M_p);
  if (pcVar1 != (curl_slist *)0x0) {
    this->optHttpHeader_ = pcVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return pcVar1 != (curl_slist *)0x0;
}

Assistant:

bool CurlWrapper::addHttpHeader(const std::string& header) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto updated_header = curl_slist_append(optHttpHeader_, header.c_str());
  if (!updated_header) {
    return false;
  }

  optHttpHeader_ = updated_header;
  return true;
}